

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float t1;
  int iVar1;
  
  if (key_index < 0) {
    return 0;
  }
  if ((uint)key_index < 0x200) {
    t1 = (GImGui->IO).KeysDownDuration[(uint)key_index];
    iVar1 = CalcTypematicRepeatAmount(t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,repeat_rate);
    return iVar1;
  }
  __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0x1088,"int ImGui::GetKeyPressedAmount(int, float, float)");
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}